

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLip.cpp
# Opt level: O3

void __thiscall SslTcpSocket::SslTcpSocket(SslTcpSocket *this)

{
  BaseSocketImpl *pBVar1;
  SslTcpSocketImpl *this_00;
  
  (this->super_TcpSocket).super_BaseSocket.Impl_._M_t.
  super___uniq_ptr_impl<BaseSocketImpl,_std::default_delete<BaseSocketImpl>_>._M_t.
  super__Tuple_impl<0UL,_BaseSocketImpl_*,_std::default_delete<BaseSocketImpl>_>.
  super__Head_base<0UL,_BaseSocketImpl_*,_false>._M_head_impl = (BaseSocketImpl *)0x0;
  (this->super_TcpSocket).super_BaseSocket._vptr_BaseSocket =
       (_func_int **)&PTR__BaseSocket_00145b18;
  this_00 = (SslTcpSocketImpl *)operator_new(0x530);
  SslTcpSocketImpl::SslTcpSocketImpl(this_00,(BaseSocket *)this);
  pBVar1 = (this->super_TcpSocket).super_BaseSocket.Impl_._M_t.
           super___uniq_ptr_impl<BaseSocketImpl,_std::default_delete<BaseSocketImpl>_>._M_t.
           super__Tuple_impl<0UL,_BaseSocketImpl_*,_std::default_delete<BaseSocketImpl>_>.
           super__Head_base<0UL,_BaseSocketImpl_*,_false>._M_head_impl;
  (this->super_TcpSocket).super_BaseSocket.Impl_._M_t.
  super___uniq_ptr_impl<BaseSocketImpl,_std::default_delete<BaseSocketImpl>_>._M_t.
  super__Tuple_impl<0UL,_BaseSocketImpl_*,_std::default_delete<BaseSocketImpl>_>.
  super__Head_base<0UL,_BaseSocketImpl_*,_false>._M_head_impl = (BaseSocketImpl *)this_00;
  if (pBVar1 != (BaseSocketImpl *)0x0) {
    (*pBVar1->_vptr_BaseSocketImpl[1])();
    return;
  }
  return;
}

Assistant:

SslTcpSocket::SslTcpSocket() : TcpSocket(false)
{
    Impl_ = make_unique<SslTcpSocketImpl>(this);
}